

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall o3dgc::Adaptive_Bit_Model::update(Adaptive_Bit_Model *this)

{
  uint uVar1;
  uint scale;
  Adaptive_Bit_Model *this_local;
  
  uVar1 = this->update_cycle + this->bit_count;
  this->bit_count = uVar1;
  if (0x2000 < uVar1) {
    this->bit_count = this->bit_count + 1 >> 1;
    this->bit_0_count = this->bit_0_count + 1 >> 1;
    if (this->bit_0_count == this->bit_count) {
      this->bit_count = this->bit_count + 1;
    }
  }
  this->bit_0_prob = this->bit_0_count * (int)(0x80000000 / (ulong)this->bit_count) >> 0x12;
  this->update_cycle = this->update_cycle * 5 >> 2;
  if (0x40 < this->update_cycle) {
    this->update_cycle = 0x40;
  }
  this->bits_until_update = this->update_cycle;
  return;
}

Assistant:

void Adaptive_Bit_Model::update(void)
    {
                                       // halve counts when a threshold is reached

      if ((bit_count += update_cycle) > BM__MaxCount) {
        bit_count = (bit_count + 1) >> 1;
        bit_0_count = (bit_0_count + 1) >> 1;
        if (bit_0_count == bit_count) ++bit_count;
      }
                                               // compute scaled bit 0 probability
      unsigned scale = 0x80000000U / bit_count;
      bit_0_prob = (bit_0_count * scale) >> (31 - BM__LengthShift);

                                                 // set frequency of model updates
      update_cycle = (5 * update_cycle) >> 2;
      if (update_cycle > 64) update_cycle = 64;
      bits_until_update = update_cycle;
    }